

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformpixmap.cpp
# Opt level: O0

QBitmap * __thiscall QPlatformPixmap::mask(QPlatformPixmap *this)

{
  bool bVar1;
  uint uVar2;
  Format FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  QRgb *pQVar7;
  uchar *__s;
  QImage *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  int x;
  uchar *dest;
  QRgb *src;
  int y;
  qsizetype bpl;
  int h;
  int w;
  bool shouldConvert;
  QImage mask;
  QImage image;
  QImage img;
  undefined4 in_stack_ffffffffffffff18;
  ImageConversionFlag in_stack_ffffffffffffff1c;
  QImage *image_00;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int iVar8;
  undefined8 in_stack_ffffffffffffff48;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  int local_ac;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 local_58 [16];
  QImageData *local_48;
  undefined1 local_40 [16];
  QImageData *local_30;
  long local_8;
  
  flags.i = (Int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  image_00 = in_RDI;
  uVar2 = (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0xf])();
  if ((uVar2 & 1) == 0) {
    QBitmap::QBitmap((QBitmap *)in_RDI);
  }
  else {
    local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0x11])(local_40);
    FVar3 = QImage::format((QImage *)local_40);
    in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c & 0xffffff;
    if (FVar3 != Format_ARGB32) {
      FVar3 = QImage::format((QImage *)local_40);
      in_stack_ffffffffffffff1c =
           CONCAT13(FVar3 != Format_ARGB32_Premultiplied,(int3)in_stack_ffffffffffffff1c);
    }
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    if ((char)(in_stack_ffffffffffffff1c >> 0x18) == '\0') {
      QImage::QImage(in_RSI,image_00);
    }
    else {
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)in_RDI,in_stack_ffffffffffffff1c);
      QImage::convertToFormat
                (in_RSI,(Format)((ulong)image_00 >> 0x20),(ImageConversionFlags)flags.i);
    }
    iVar4 = QImage::width((QImage *)local_58);
    iVar5 = QImage::height((QImage *)local_58);
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage(in_RSI,(int)((ulong)image_00 >> 0x20),(int)image_00,
                   (Format)((ulong)in_RDI >> 0x20));
    bVar1 = QImage::isNull((QImage *)local_78);
    if (bVar1) {
      QBitmap::QBitmap((QBitmap *)in_RDI);
    }
    else {
      (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0x14])();
      QImage::setDevicePixelRatio
                (in_RDI,(qreal)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QImage::setColorCount
                ((QImage *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (int)((ulong)in_RSI >> 0x20));
      QColor::QColor((QColor *)in_RSI,(GlobalColor)((ulong)image_00 >> 0x20));
      QColor::rgba((QColor *)in_RSI);
      QImage::setColor((QImage *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (int)((ulong)in_RSI >> 0x20),(QRgb)in_RSI);
      QColor::QColor((QColor *)in_RSI,(GlobalColor)((ulong)image_00 >> 0x20));
      QColor::rgba((QColor *)in_RSI);
      QImage::setColor((QImage *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (int)((ulong)in_RSI >> 0x20),(QRgb)in_RSI);
      __n = QImage::bytesPerLine((QImage *)local_78);
      for (local_ac = 0; local_ac < iVar5; local_ac = local_ac + 1) {
        pQVar7 = (QRgb *)QImage::scanLine((QImage *)local_58,local_ac);
        __s = QImage::scanLine(image_00,(int)((ulong)in_RDI >> 0x20));
        memset(__s,0,__n);
        for (iVar8 = 0; iVar8 < iVar4; iVar8 = iVar8 + 1) {
          iVar6 = qAlpha(*pQVar7);
          if (0 < iVar6) {
            __s[iVar8 >> 3] = __s[iVar8 >> 3] | (byte)(1 << ((byte)iVar8 & 7));
          }
          pQVar7 = pQVar7 + 1;
        }
      }
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)in_RDI,in_stack_ffffffffffffff1c);
      QBitmap::fromImage(image_00,(QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)
                                  SUB84(__n >> 0x20,0));
    }
    QImage::~QImage(in_RDI);
    QImage::~QImage(in_RDI);
    QImage::~QImage(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QBitmap *)image_00;
  }
  __stack_chk_fail();
}

Assistant:

QBitmap QPlatformPixmap::mask() const
{
    if (!hasAlphaChannel())
        return QBitmap();

    QImage img = toImage();
    bool shouldConvert = (img.format() != QImage::Format_ARGB32 && img.format() != QImage::Format_ARGB32_Premultiplied);
    const QImage image = (shouldConvert ? std::move(img).convertToFormat(QImage::Format_ARGB32_Premultiplied) : img);
    const int w = image.width();
    const int h = image.height();

    QImage mask(w, h, QImage::Format_MonoLSB);
    if (mask.isNull()) // allocation failed
        return QBitmap();

    mask.setDevicePixelRatio(devicePixelRatio());
    mask.setColorCount(2);
    mask.setColor(0, QColor(Qt::color0).rgba());
    mask.setColor(1, QColor(Qt::color1).rgba());

    const qsizetype bpl = mask.bytesPerLine();

    for (int y = 0; y < h; ++y) {
        const QRgb *src = reinterpret_cast<const QRgb*>(image.scanLine(y));
        uchar *dest = mask.scanLine(y);
        memset(dest, 0, bpl);
        for (int x = 0; x < w; ++x) {
            if (qAlpha(*src) > 0)
                dest[x >> 3] |= (1 << (x & 7));
            ++src;
        }
    }

    return QBitmap::fromImage(std::move(mask));
}